

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inlining.cpp
# Opt level: O1

vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> * __thiscall
wasm::anon_unknown_18::FunctionSplitter::getForwardedArgs
          (vector<wasm::Expression_*,_std::allocator<wasm::Expression_*>_> *__return_storage_ptr__,
          FunctionSplitter *this,Function *func,Builder *builder)

{
  Expression *in_RAX;
  size_t sVar1;
  Type TVar2;
  Index i;
  Index index;
  ulong uVar3;
  Expression *local_38;
  
  (__return_storage_ptr__->
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  uVar3 = 0;
  local_38 = in_RAX;
  while( true ) {
    sVar1 = Function::getNumParams((Function *)this);
    index = (Index)uVar3;
    if (sVar1 <= uVar3) break;
    TVar2 = Function::getLocalType((Function *)this,index);
    local_38 = (Expression *)
               MixedArena::allocSpace
                         ((MixedArena *)
                          ((func->super_Importable).super_Named.name.super_IString.str._M_len +
                          0x200),0x18,8);
    local_38->_id = LocalGetId;
    *(Index *)(local_38 + 1) = index;
    (local_38->type).id = TVar2.id;
    std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::
    emplace_back<wasm::Expression*>
              ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)__return_storage_ptr__
               ,&local_38);
    uVar3 = (ulong)(index + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<Expression*> getForwardedArgs(Function* func, Builder& builder) {
    std::vector<Expression*> args;
    for (Index i = 0; i < func->getNumParams(); i++) {
      args.push_back(builder.makeLocalGet(i, func->getLocalType(i)));
    }
    return args;
  }